

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

type __thiscall
nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Visibility>_>::operator=
          (optional<tinyusdz::Animatable<tinyusdz::Visibility>_> *this,
          optional<tinyusdz::Animatable<tinyusdz::Visibility>_> *other)

{
  bool bVar1;
  value_type *pvVar2;
  value_type *this_00;
  optional<tinyusdz::Animatable<tinyusdz::Visibility>_> *other_local;
  optional<tinyusdz::Animatable<tinyusdz::Visibility>_> *this_local;
  
  bVar1 = has_value(this);
  if ((!bVar1) || (bVar1 = has_value(other), bVar1)) {
    bVar1 = has_value(this);
    if ((bVar1) || (bVar1 = has_value(other), !bVar1)) {
      bVar1 = has_value(this);
      if ((bVar1) && (bVar1 = has_value(other), bVar1)) {
        pvVar2 = operator*(other);
        this_00 = detail::storage_t<tinyusdz::Animatable<tinyusdz::Visibility>_>::value
                            ((storage_t<tinyusdz::Animatable<tinyusdz::Visibility>_> *)
                             &this->contained);
        tinyusdz::Animatable<tinyusdz::Visibility>::operator=(this_00,pvVar2);
      }
    }
    else {
      pvVar2 = operator*(other);
      optional<tinyusdz::Animatable<tinyusdz::Visibility>>::
      initialize<tinyusdz::Animatable<tinyusdz::Visibility>>
                ((optional<tinyusdz::Animatable<tinyusdz::Visibility>> *)this,pvVar2);
    }
  }
  else {
    reset(this);
  }
  return this;
}

Assistant:

operator=( optional && other ) noexcept
    {
        if      ( (has_value() == true ) && (other.has_value() == false) ) { reset(); }
        else if ( (has_value() == false) && (other.has_value() == true ) ) { initialize( std::move( *other ) ); }
        else if ( (has_value() == true ) && (other.has_value() == true ) ) { contained.value() = std::move( *other ); }
        return *this;
    }